

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testInit
          (SSBLayoutQualifierConflictTest *this)

{
  pointer *pptVar1;
  iterator __position;
  testCase tVar2;
  bool bVar3;
  GLuint qualifier;
  QUALIFIERS QVar4;
  GLuint stage_1;
  GLuint stage;
  long lVar5;
  testCase test_case;
  bool stage_support [6];
  testCase local_38;
  char acStack_2e [6];
  
  lVar5 = 0;
  do {
    bVar3 = isStageSupported(this,(STAGES)lVar5);
    acStack_2e[lVar5] = bVar3;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  QVar4 = DEFAULT;
  do {
    lVar5 = 0;
    do {
      if (acStack_2e[lVar5] != '\0') {
        local_38.m_stage = (STAGES)lVar5;
        __position._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_38.m_qualifier = QVar4;
          std::
          vector<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase,std::allocator<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase>>
          ::
          _M_realloc_insert<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase_const&>
                    ((vector<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase,std::allocator<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase>>
                      *)&this->m_test_cases,__position,&local_38);
        }
        else {
          tVar2.m_stage = local_38.m_stage;
          tVar2.m_qualifier = QVar4;
          *__position._M_current = tVar2;
          pptVar1 = &(this->m_test_cases).
                     super__Vector_base<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    QVar4 = QVar4 + STD140;
  } while (QVar4 != QUALIFIERS_MAX);
  return;
}

Assistant:

void SSBLayoutQualifierConflictTest::testInit()
{
	bool stage_support[Utils::Shader::STAGE_MAX];

	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		stage_support[stage] = isStageSupported((Utils::Shader::STAGES)stage);
	}

	for (GLuint qualifier = 0; qualifier < QUALIFIERS_MAX; ++qualifier)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if (false == stage_support[stage])
			{
				continue;
			}

			testCase test_case = { (QUALIFIERS)qualifier, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}